

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<unsigned_char,_long_long,_2>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *t,longlong *u,uchar *result)

{
  long lVar1;
  uchar uVar2;
  
  lVar1 = *u;
  if (lVar1 == -1) {
    uVar2 = '\0';
  }
  else {
    if (lVar1 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    uVar2 = SUB161(ZEXT116(*t) % SEXT816(lVar1),0);
  }
  *result = uVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)((std::int64_t)t % (std::int64_t)u);
    }